

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsGetWeakReferenceValue(JsWeakRef weakRef,JsValueRef *value)

{
  anon_class_16_2_0bf674ff fn;
  JsValueRef *local_20;
  JsValueRef *value_local;
  JsWeakRef weakRef_local;
  
  if (weakRef == (JsWeakRef)0x0) {
    weakRef_local._4_4_ = JsErrorInvalidArgument;
  }
  else if (value == (JsValueRef *)0x0) {
    weakRef_local._4_4_ = JsErrorNullArgument;
  }
  else {
    *value = (JsValueRef)0x0;
    fn.value = &local_20;
    fn.weakRef = &value_local;
    local_20 = value;
    value_local = (JsValueRef *)weakRef;
    weakRef_local._4_4_ = GlobalAPIWrapper_NoRecord<JsGetWeakReferenceValue::__0>(fn);
  }
  return weakRef_local._4_4_;
}

Assistant:

CHAKRA_API JsGetWeakReferenceValue(
    _In_ JsWeakRef weakRef,
    _Out_ JsValueRef* value)
{
    VALIDATE_JSREF(weakRef);
    PARAM_NOT_NULL(value);
    *value = JS_INVALID_REFERENCE;

    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        Memory::RecyclerWeakReference<char>* recyclerWeakReference =
            reinterpret_cast<Memory::RecyclerWeakReference<char>*>(weakRef);
        *value = reinterpret_cast<JsValueRef>(recyclerWeakReference->Get());
        return JsNoError;
    });
}